

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRenderTarget.cpp
# Opt level: O0

void __thiscall
tcu::RenderTarget::RenderTarget
          (RenderTarget *this,int width,int height,PixelFormat *format,int depthBits,int stencilBits
          ,int numSamples)

{
  int iVar1;
  int stencilBits_local;
  int depthBits_local;
  PixelFormat *format_local;
  int height_local;
  int width_local;
  RenderTarget *this_local;
  
  this->m_width = width;
  this->m_height = height;
  iVar1 = format->greenBits;
  (this->m_pixelFormat).redBits = format->redBits;
  (this->m_pixelFormat).greenBits = iVar1;
  iVar1 = format->alphaBits;
  (this->m_pixelFormat).blueBits = format->blueBits;
  (this->m_pixelFormat).alphaBits = iVar1;
  this->m_depthBits = depthBits;
  this->m_stencilBits = stencilBits;
  this->m_numSamples = numSamples;
  return;
}

Assistant:

RenderTarget::RenderTarget (int width, int height, const PixelFormat& format, int depthBits, int stencilBits, int numSamples)
	: m_width		(width)
	, m_height		(height)
	, m_pixelFormat	(format)
	, m_depthBits	(depthBits)
	, m_stencilBits	(stencilBits)
	, m_numSamples	(numSamples)
{
}